

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptNativeFloatArray *
Js::JavascriptArray::BoxStackInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance,bool deepCopy)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *this;
  SparseArraySegmentBase **ppSVar5;
  Recycler *pRVar6;
  SparseArraySegmentBase *pSVar7;
  JavascriptNativeFloatArray *pJVar8;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  size_t local_38;
  size_t inlineSlotsSize;
  JavascriptNativeFloatArray **boxedInstanceRef;
  JavascriptNativeFloatArray *boxedInstance;
  DynamicObject *pDStack_18;
  bool deepCopy_local;
  JavascriptNativeFloatArray *instance_local;
  
  boxedInstance._7_1_ = deepCopy;
  pDStack_18 = (DynamicObject *)instance;
  bVar3 = ThreadContext::IsOnStack(instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f6d,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((boxedInstance._7_1_ & 1) == 0) {
    inlineSlotsSize = (size_t)&pDStack_18[-1].field_1;
    if (*(anon_union_8_2_815e7e51_for_DynamicObject_2 *)inlineSlotsSize !=
        (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
      return (JavascriptNativeFloatArray *)
             *(anon_union_8_2_815e7e51_for_DynamicObject_2 *)inlineSlotsSize;
    }
  }
  else {
    inlineSlotsSize = 0;
  }
  boxedInstanceRef = (JavascriptNativeFloatArray **)0x0;
  this = DynamicObject::GetTypeHandler(pDStack_18);
  local_38 = DynamicTypeHandler::GetInlineSlotsSize(this);
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pDStack_18[1].super_RecyclableObject.type);
  bVar3 = ThreadContext::IsOnStack(*ppSVar5);
  if ((bVar3) || ((boxedInstance._7_1_ & 1) != 0)) {
    if ((boxedInstance._7_1_ & 1) == 0) {
      pRVar6 = RecyclableObject::GetRecycler(&pDStack_18->super_RecyclableObject);
      sVar2 = local_38;
      pSVar7 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                         ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)
                          &pDStack_18[1].super_RecyclableObject.type);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&JavascriptNativeFloatArray::typeinfo,
                 sVar2 + 0x18 + (ulong)pSVar7->size * 8,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                 ,0x2f90);
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_60);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)
                 &pDStack_18[1].super_RecyclableObject.type);
      local_70 = Memory::Recycler::AllocZero;
      local_68 = 0;
      pJVar8 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x473830,0);
      JavascriptNativeFloatArray::JavascriptNativeFloatArray
                (pJVar8,(JavascriptNativeFloatArray *)pDStack_18,true,false);
      boxedInstanceRef = (JavascriptNativeFloatArray **)pJVar8;
    }
    else {
      boxedInstanceRef =
           (JavascriptNativeFloatArray **)
           DeepCopyInstance<Js::JavascriptNativeFloatArray>
                     ((JavascriptNativeFloatArray *)pDStack_18);
    }
  }
  else if (local_38 == 0) {
    pRVar6 = RecyclableObject::GetRecycler(&pDStack_18->super_RecyclableObject);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d0,(type_info *)&JavascriptNativeFloatArray::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0x2f99);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_d0);
    pJVar8 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x43c4b0);
    JavascriptNativeFloatArray::JavascriptNativeFloatArray
              (pJVar8,(JavascriptNativeFloatArray *)pDStack_18,false,false);
    boxedInstanceRef = (JavascriptNativeFloatArray **)pJVar8;
  }
  else {
    pRVar6 = RecyclableObject::GetRecycler(&pDStack_18->super_RecyclableObject);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&JavascriptNativeFloatArray::typeinfo,local_38,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0x2f95);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_98);
    local_a8 = Memory::Recycler::AllocZero;
    local_a0 = 0;
    pJVar8 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar6,0x473830,0);
    JavascriptNativeFloatArray::JavascriptNativeFloatArray
              (pJVar8,(JavascriptNativeFloatArray *)pDStack_18,false,false);
    boxedInstanceRef = (JavascriptNativeFloatArray **)pJVar8;
  }
  if (inlineSlotsSize != 0) {
    *(JavascriptNativeFloatArray ***)inlineSlotsSize = boxedInstanceRef;
  }
  return (JavascriptNativeFloatArray *)boxedInstanceRef;
}

Assistant:

T * JavascriptArray::BoxStackInstance(T * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        T * boxedInstance;
        T ** boxedInstanceRef;
        if (!deepCopy)
        {
            // On the stack, the we reserved a pointer before the object as to store the boxed value
            boxedInstanceRef = ((T **)instance) - 1;
            boxedInstance = *boxedInstanceRef;
            if (boxedInstance)
            {
                return boxedInstance;
            }
        }
        else
        {
            // When doing a deep copy, do not cache the boxed value to ensure that only shallow copies
            // are reused
            boxedInstance = nullptr;
            boxedInstanceRef = nullptr;
        }

        const size_t inlineSlotsSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (ThreadContext::IsOnStack(instance->head) || deepCopy)
        {
            // Reallocate both the object as well as the head segment when the head is on the stack or
            // when a deep copy is needed. This is to prevent a scenario where box may leave either one
            // on the stack when both must be on the heap.
            if (deepCopy)
            {
                boxedInstance = DeepCopyInstance(instance);
            }
            else
            {
                boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(),
                    inlineSlotsSize + sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement),
                    T, instance, true /*boxHead*/, false /*deepCopy*/);
            }
        }
        else if(inlineSlotsSize)
        {
            boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(), inlineSlotsSize, T, instance, false, false);
        }
        else
        {
            boxedInstance = RecyclerNew(instance->GetRecycler(), T, instance, false, false);
        }

        if (boxedInstanceRef != nullptr)
        {
            *boxedInstanceRef = boxedInstance;
        }
        return boxedInstance;
    }